

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::normalize(MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *mf)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  int iVar6;
  undefined8 *puVar7;
  MLNodeLaplacian *pMVar8;
  FabArray<amrex::FArrayBox> *this_00;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  MFIter mfi;
  long local_2f0;
  long local_2e8;
  long local_2d8;
  int local_290;
  Box local_28c;
  long local_270;
  long local_268;
  ulong local_260;
  long local_258;
  int local_250;
  int local_24c;
  undefined8 *local_248;
  long local_240;
  Array4<const_double> local_238;
  Array4<const_int> local_1f8;
  Array4<double> local_1b8;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  long local_150;
  long local_148;
  MLNodeLaplacian *local_140;
  FabArray<amrex::FArrayBox> *local_138;
  FabArray<amrex::IArrayBox> *local_130;
  long local_128;
  long local_120;
  ulong local_118;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  pVVar5 = (this->m_sigma).
           super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
           .
           super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (**(long **)&(pVVar5->
                  super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                  ).
                  super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
      != 0) {
    local_148 = (long)mglev;
    local_248 = (undefined8 *)
                (local_148 * 0x18 +
                *(long *)&pVVar5[amrlev].
                          super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                );
    local_150 = *(long *)&(this->m_stencil).
                          super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[amrlev].
                          super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ;
    lVar24 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    lVar17 = local_148 * 200;
    dVar2 = *(double *)(lVar24 + 0x38 + lVar17);
    dVar3 = *(double *)(lVar24 + 0x40 + lVar17);
    dVar4 = *(double *)(lVar24 + 0x48 + lVar17);
    local_130 = *(FabArray<amrex::IArrayBox> **)
                 (*(long *)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[amrlev].
                            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 + local_148 * 8);
    local_158 = *(double *)
                 (*(long *)&(this->m_s0_norm0).
                            super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[amrlev].
                            super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_> + local_148 * 8);
    local_250 = mglev;
    MFIter::MFIter(&local_90,(FabArrayBase *)mf,true);
    if (local_90.currentIndex < local_90.endIndex) {
      local_168 = dVar2 * 0.027777777777777776 * dVar2;
      local_170 = dVar3 * 0.027777777777777776 * dVar3;
      local_160 = dVar4 * 0.027777777777777776 * dVar4;
      local_178 = (local_168 + local_170 + local_160) * -4.0;
      local_140 = this;
      local_138 = &mf->super_FabArray<amrex::FArrayBox>;
      do {
        this_00 = local_138;
        pMVar8 = local_140;
        MFIter::tilebox(&local_28c,&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1b8,this_00,&local_90);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_1f8,local_130,&local_90)
        ;
        puVar7 = local_248;
        if ((pMVar8->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_238,*(FabArray<amrex::FArrayBox> **)(local_150 + local_148 * 8),
                     &local_90);
          if (local_28c.smallend.vect[2] <= local_28c.bigend.vect[2]) {
            lVar24 = (long)local_28c.smallend.vect[0];
            iVar9 = local_28c.smallend.vect[2];
            do {
              if (local_28c.smallend.vect[1] <= local_28c.bigend.vect[1]) {
                lVar10 = (long)iVar9;
                lVar26 = (long)local_1f8.p +
                         (lVar10 - local_1f8.begin.z) * local_1f8.kstride * 4 +
                         ((long)local_28c.smallend.vect[1] - (long)local_1f8.begin.y) *
                         local_1f8.jstride * 4 + (long)local_1f8.begin.x * -4 + lVar24 * 4;
                lVar17 = (long)local_28c.smallend.vect[1];
                do {
                  if (local_28c.smallend.vect[0] <= local_28c.bigend.vect[0]) {
                    lVar27 = (lVar17 - local_1b8.begin.y) * local_1b8.jstride;
                    lVar15 = (lVar10 - local_1b8.begin.z) * local_1b8.kstride;
                    lVar23 = 0;
                    do {
                      if ((*(int *)(lVar26 + lVar23 * 4) == 0) &&
                         (local_158 <
                          ABS(local_238.p
                              [lVar24 + (((lVar17 - local_238.begin.y) * local_238.jstride +
                                         (lVar10 - local_238.begin.z) * local_238.kstride + lVar23)
                                        - (long)local_238.begin.x)]))) {
                        local_1b8.p[lVar24 + ((lVar27 + lVar15 + lVar23) - (long)local_1b8.begin.x)]
                             = local_1b8.p
                               [lVar24 + ((lVar27 + lVar15 + lVar23) - (long)local_1b8.begin.x)] /
                               local_238.p
                               [lVar24 + (((lVar17 - local_238.begin.y) * local_238.jstride +
                                          (lVar10 - local_238.begin.z) * local_238.kstride + lVar23)
                                         - (long)local_238.begin.x)];
                      }
                      lVar23 = lVar23 + 1;
                    } while ((local_28c.bigend.vect[0] - local_28c.smallend.vect[0]) + 1 !=
                             (int)lVar23);
                  }
                  lVar17 = lVar17 + 1;
                  lVar26 = lVar26 + local_1f8.jstride * 4;
                } while (local_28c.bigend.vect[1] + 1U != (int)lVar17);
              }
              bVar31 = iVar9 != local_28c.bigend.vect[2];
              iVar9 = iVar9 + 1;
            } while (bVar31);
          }
        }
        else if (((local_250 < 1) || (pMVar8->m_use_harmonic_average == false)) &&
                (pMVar8->m_use_mapped != true)) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_238,(FabArray<amrex::FArrayBox> *)*local_248,&local_90);
          local_258 = CONCAT44(local_258._4_4_,local_28c.bigend.vect[2]);
          if (local_28c.smallend.vect[2] <= local_28c.bigend.vect[2]) {
            local_260 = (ulong)(uint)local_28c.bigend.vect[1];
            local_270 = (long)local_28c.smallend.vect[1];
            lVar17 = (long)local_28c.smallend.vect[0];
            local_268 = lVar17 * 4;
            lVar24 = lVar17 * 8;
            iVar9 = local_28c.smallend.vect[2] + -1;
            iVar6 = local_28c.smallend.vect[2];
            do {
              if (local_28c.smallend.vect[1] <= local_28c.bigend.vect[1]) {
                lVar10 = (long)iVar6;
                lVar26 = (long)local_1f8.p +
                         (local_270 - local_1f8.begin.y) * local_1f8.jstride * 4 +
                         (lVar10 - local_1f8.begin.z) * local_1f8.kstride * 4 +
                         (long)local_1f8.begin.x * -4 + local_268;
                local_2e8 = local_270;
                iVar1 = local_28c.smallend.vect[1] + -1;
                do {
                  if (local_28c.smallend.vect[0] <= local_28c.bigend.vect[0]) {
                    lVar16 = (long)local_238.begin.x;
                    lVar19 = (~local_238.begin.y + (int)local_2e8) * local_238.jstride;
                    lVar21 = (local_2e8 - local_1b8.begin.y) * local_1b8.jstride;
                    lVar23 = (lVar10 - local_1b8.begin.z) * local_1b8.kstride;
                    lVar27 = (~local_238.begin.z + iVar6) * local_238.kstride;
                    lVar18 = (iVar6 - local_238.begin.z) * local_238.kstride;
                    lVar28 = (lVar10 - local_238.begin.z) * local_238.kstride * 8;
                    lVar15 = (long)(iVar9 - local_238.begin.z) * local_238.kstride * 8;
                    lVar30 = local_238.jstride * (local_2e8 - local_238.begin.y);
                    lVar25 = (long)(iVar1 - local_238.begin.y) * local_238.jstride * 8;
                    lVar20 = local_238.jstride * 8 * (local_2e8 - local_238.begin.y);
                    lVar29 = 0;
                    do {
                      if (*(int *)(lVar26 + lVar29 * 4) == 0) {
                        lVar13 = (long)((int)lVar29 +
                                       ((local_28c.smallend.vect[0] + -1) - local_238.begin.x));
                        local_1b8.p[lVar17 + ((lVar21 + lVar23 + lVar29) - (long)local_1b8.begin.x)]
                             = local_1b8.p
                               [lVar17 + ((lVar21 + lVar23 + lVar29) - (long)local_1b8.begin.x)] /
                               ((local_238.p[lVar19 + lVar13 + lVar27] +
                                 *(double *)
                                  ((long)local_238.p +
                                  lVar29 * 8 + lVar25 + lVar15 + lVar16 * -8 + lVar24) +
                                 local_238.p[lVar30 + lVar13 + lVar27] +
                                 *(double *)
                                  ((long)local_238.p +
                                  lVar29 * 8 + lVar20 + lVar15 + lVar16 * -8 + lVar24) +
                                 local_238.p[lVar19 + lVar13 + lVar18] +
                                 *(double *)
                                  ((long)local_238.p +
                                  lVar29 * 8 + lVar28 + lVar25 + lVar16 * -8 + lVar24) +
                                 local_238.p[lVar30 + lVar13 + lVar18] +
                                *(double *)
                                 ((long)local_238.p +
                                 lVar29 * 8 + lVar28 + lVar20 + lVar16 * -8 + lVar24)) * local_178);
                      }
                      lVar29 = lVar29 + 1;
                    } while ((local_28c.bigend.vect[0] - local_28c.smallend.vect[0]) + 1 !=
                             (int)lVar29);
                  }
                  local_2e8 = local_2e8 + 1;
                  lVar26 = lVar26 + local_1f8.jstride * 4;
                  iVar1 = iVar1 + 1;
                } while (local_28c.bigend.vect[1] + 1U != (int)local_2e8);
              }
              iVar9 = iVar9 + 1;
              bVar31 = iVar6 != local_28c.bigend.vect[2];
              iVar6 = iVar6 + 1;
            } while (bVar31);
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_238,(FabArray<amrex::FArrayBox> *)*local_248,&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_d0,(FabArray<amrex::FArrayBox> *)puVar7[1],&local_90);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_110,(FabArray<amrex::FArrayBox> *)puVar7[2],&local_90);
          local_24c = local_28c.bigend.vect[2];
          if (local_28c.smallend.vect[2] <= local_28c.bigend.vect[2]) {
            local_118 = (ulong)(uint)local_28c.bigend.vect[1];
            local_240 = (long)local_28c.smallend.vect[1];
            lVar17 = (long)local_28c.smallend.vect[0];
            local_120 = lVar17 * 4;
            lVar24 = lVar17 * 8;
            local_128 = local_240 + -1;
            local_290 = local_28c.smallend.vect[2] + -1;
            iVar9 = local_28c.smallend.vect[2];
            do {
              if (local_28c.smallend.vect[1] <= local_28c.bigend.vect[1]) {
                lVar26 = (long)iVar9;
                lVar10 = (long)local_290;
                lVar15 = (long)local_1f8.p +
                         (local_240 - local_1f8.begin.y) * local_1f8.jstride * 4 +
                         (lVar26 - local_1f8.begin.z) * local_1f8.kstride * 4 +
                         (long)local_1f8.begin.x * -4 + local_120;
                local_2f0 = local_240;
                local_2d8 = local_128;
                do {
                  if (local_28c.smallend.vect[0] <= local_28c.bigend.vect[0]) {
                    local_258 = (long)local_238.begin.z;
                    local_270 = local_238.kstride;
                    lVar28 = (long)local_d0.begin.x;
                    local_260 = (ulong)local_d0.begin.y;
                    local_268 = (long)local_d0.begin.z;
                    lVar18 = (long)local_110.begin.x;
                    lVar12 = (local_2f0 - local_1b8.begin.y) * local_1b8.jstride;
                    lVar11 = (lVar26 - local_1b8.begin.z) * local_1b8.kstride;
                    lVar16 = (lVar26 - local_110.begin.z) * local_110.kstride * 8;
                    lVar25 = (lVar10 - local_110.begin.z) * local_110.kstride * 8;
                    lVar27 = (local_2d8 - local_110.begin.y) * local_110.jstride * 8;
                    lVar20 = (local_2f0 - local_110.begin.y) * local_110.jstride * 8;
                    lVar23 = lVar27 + lVar16 + lVar18 * -8 + lVar24;
                    lVar27 = lVar27 + lVar25 + lVar18 * -8 + lVar24;
                    lVar16 = lVar16 + lVar20 + lVar18 * -8 + lVar24;
                    lVar18 = lVar20 + lVar25 + lVar18 * -8 + lVar24;
                    lVar19 = (lVar26 - local_268) * local_d0.kstride * 8;
                    lVar21 = (lVar10 - local_268) * local_d0.kstride * 8;
                    lVar25 = (local_2d8 - local_260) * local_d0.jstride * 8;
                    lVar30 = (local_2f0 - local_260) * local_d0.jstride * 8;
                    lVar20 = lVar25 + lVar19 + lVar28 * -8 + lVar24;
                    lVar25 = lVar25 + lVar21 + lVar28 * -8 + lVar24;
                    lVar19 = lVar19 + lVar30 + lVar28 * -8 + lVar24;
                    lVar21 = lVar30 + lVar21 + lVar28 * -8 + lVar24;
                    lVar29 = (lVar26 - local_258) * local_238.kstride * 8;
                    lVar13 = (lVar10 - local_258) * local_238.kstride * 8;
                    lVar30 = (local_2d8 - local_238.begin.y) * local_238.jstride * 8;
                    lVar22 = (local_2f0 - local_238.begin.y) * local_238.jstride * 8;
                    lVar14 = (long)local_238.begin.x;
                    lVar28 = lVar30 + lVar29 + lVar14 * -8 + lVar24;
                    lVar30 = lVar30 + lVar13 + lVar14 * -8 + lVar24;
                    lVar29 = lVar29 + lVar22 + lVar14 * -8 + lVar24;
                    lVar13 = lVar22 + lVar13 + lVar14 * -8 + lVar24;
                    lVar14 = 0;
                    do {
                      if (*(int *)(lVar15 + lVar14 * 4) == 0) {
                        local_1b8.p[lVar17 + ((lVar12 + lVar11 + lVar14) - (long)local_1b8.begin.x)]
                             = local_1b8.p
                               [lVar17 + ((lVar12 + lVar11 + lVar14) - (long)local_1b8.begin.x)] /
                               (((*(double *)((long)local_110.p + lVar14 * 8 + lVar27 + -8) +
                                  *(double *)((long)local_110.p + lVar14 * 8 + lVar27) +
                                  *(double *)((long)local_110.p + lVar14 * 8 + lVar18 + -8) +
                                  *(double *)((long)local_110.p + lVar14 * 8 + lVar18) +
                                  *(double *)((long)local_110.p + lVar14 * 8 + lVar23 + -8) +
                                  *(double *)((long)local_110.p + lVar14 * 8 + lVar23) +
                                  *(double *)((long)local_110.p + lVar14 * 8 + lVar16 + -8) +
                                 *(double *)((long)local_110.p + lVar14 * 8 + lVar16)) * local_160 +
                                (*(double *)((long)local_238.p + lVar14 * 8 + lVar30 + -8) +
                                 *(double *)((long)local_238.p + lVar14 * 8 + lVar30) +
                                 *(double *)((long)local_238.p + lVar14 * 8 + lVar13 + -8) +
                                 *(double *)((long)local_238.p + lVar14 * 8 + lVar13) +
                                 *(double *)((long)local_238.p + lVar14 * 8 + lVar28 + -8) +
                                 *(double *)((long)local_238.p + lVar14 * 8 + lVar28) +
                                 *(double *)((long)local_238.p + lVar14 * 8 + lVar29 + -8) +
                                *(double *)((long)local_238.p + lVar14 * 8 + lVar29)) * local_168 +
                                (*(double *)((long)local_d0.p + lVar14 * 8 + lVar25 + -8) +
                                 *(double *)((long)local_d0.p + lVar14 * 8 + lVar25) +
                                 *(double *)((long)local_d0.p + lVar14 * 8 + lVar21 + -8) +
                                 *(double *)((long)local_d0.p + lVar14 * 8 + lVar21) +
                                 *(double *)((long)local_d0.p + lVar14 * 8 + lVar20 + -8) +
                                 *(double *)((long)local_d0.p + lVar14 * 8 + lVar20) +
                                 *(double *)((long)local_d0.p + lVar14 * 8 + lVar19 + -8) +
                                *(double *)((long)local_d0.p + lVar14 * 8 + lVar19)) * local_170) *
                               -4.0);
                      }
                      lVar14 = lVar14 + 1;
                    } while ((local_28c.bigend.vect[0] - local_28c.smallend.vect[0]) + 1 !=
                             (int)lVar14);
                  }
                  local_2f0 = local_2f0 + 1;
                  lVar15 = lVar15 + local_1f8.jstride * 4;
                  local_2d8 = local_2d8 + 1;
                } while (local_28c.bigend.vect[1] + 1U != (int)local_2f0);
              }
              local_290 = local_290 + 1;
              bVar31 = iVar9 != local_28c.bigend.vect[2];
              iVar9 = iVar9 + 1;
            } while (bVar31);
          }
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    BL_PROFILE("MLNodeLaplacian::normalize()");

    if (m_sigma[0][0][0] == nullptr) return;

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();
    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];
    const Real s0_norm0 = m_s0_norm0[amrlev][mglev];

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mf.isFusingCandidate()) {
        const auto& ma = mf.arrays();
        const auto& dmsk_ma = dmsk.const_arrays();

        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            const auto& sten_ma = stencil->const_arrays();
            ParallelFor(mf,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                mlndlap_normalize_sten(i,j,k,ma[box_no],sten_ma[box_no],dmsk_ma[box_no],s0_norm0);
            });
        }
        else if ( (m_use_harmonic_average && mglev > 0) ||
                   m_use_mapped )
        {
            AMREX_D_TERM(const auto& sx_ma = sigma[0]->const_arrays();,
                         const auto& sy_ma = sigma[1]->const_arrays();,
                         const auto& sz_ma = sigma[2]->const_arrays(););
            ParallelFor(mf,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                mlndlap_normalize_ha(i,j,k,ma[box_no],AMREX_D_DECL(sx_ma[box_no],sy_ma[box_no],sz_ma[box_no]),dmsk_ma[box_no],dxinv);
            });
        }
        else
        {
            const auto& sx_ma = sigma[0]->const_arrays();
            ParallelFor(mf,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                mlndlap_normalize_aa(i,j,k,ma[box_no],sx_ma[box_no],dmsk_ma[box_no],dxinv);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& arr = mf.array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);
            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
                Array4<Real const> const& stenarr = stencil->const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_normalize_sten(i,j,k,arr,stenarr,dmskarr,s0_norm0);
                });
            }
            else if ( (m_use_harmonic_average && mglev > 0) ||
                       m_use_mapped )
            {
                AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                             Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                             Array4<Real const> const& szarr = sigma[2]->const_array(mfi););

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_normalize_ha(i,j,k,arr,AMREX_D_DECL(sxarr,syarr,szarr),dmskarr,dxinv);
                });
            }
            else
            {
                Array4<Real const> const& sarr = sigma[0]->const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_normalize_aa(i,j,k,arr,sarr,dmskarr,dxinv);
                });
            }
        }
    }
}